

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

void __thiscall
spvtools::val::Function::Function
          (Function *this,uint32_t function_id,uint32_t result_type_id,
          FunctionControlMask function_control,uint32_t function_type_id)

{
  uint32_t function_type_id_local;
  FunctionControlMask function_control_local;
  uint32_t result_type_id_local;
  uint32_t function_id_local;
  Function *this_local;
  
  this->id_ = function_id;
  this->function_type_id_ = function_type_id;
  this->result_type_id_ = result_type_id;
  this->function_control_ = function_control;
  this->declaration_type_ = kFunctionDeclUnknown;
  this->end_has_been_registered_ = false;
  memset(&this->blocks_,0,0x38);
  std::
  unordered_map<unsigned_int,_spvtools::val::BasicBlock,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>_>_>
  ::unordered_map(&this->blocks_);
  std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::vector
            (&this->ordered_blocks_);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->undefined_blocks_);
  this->current_block_ = (BasicBlock *)0x0;
  BasicBlock::BasicBlock(&this->pseudo_entry_block_,0);
  BasicBlock::BasicBlock(&this->pseudo_exit_block_,0x400000);
  std::
  unordered_map<const_spvtools::val::BasicBlock_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>_>
  ::unordered_map(&this->augmented_successors_map_);
  std::
  unordered_map<const_spvtools::val::BasicBlock_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>_>
  ::unordered_map(&this->augmented_predecessors_map_);
  std::
  unordered_map<const_spvtools::val::BasicBlock_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>_>
  ::unordered_map(&this->loop_header_successors_plus_continue_target_map_);
  memset(&this->cfg_constructs_,0,0x18);
  std::__cxx11::list<spvtools::val::Construct,_std::allocator<spvtools::val::Construct>_>::list
            (&this->cfg_constructs_);
  memset(&this->variable_ids_,0,0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->variable_ids_);
  memset(&this->parameter_ids_,0,0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->parameter_ids_);
  std::
  unordered_map<std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_spvtools::val::Construct_*,_spvtools::val::bb_constr_type_pair_hash,_std::equal_to<std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>_>,_std::allocator<std::pair<const_std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_spvtools::val::Construct_*>_>_>
  ::unordered_map(&this->entry_block_to_construct_);
  std::
  unordered_map<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::hash<spvtools::val::BasicBlock_*>,_std::equal_to<spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_spvtools::val::BasicBlock_*>_>_>
  ::unordered_map(&this->merge_block_header_);
  std::
  unordered_map<spvtools::val::BasicBlock_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>,_std::hash<spvtools::val::BasicBlock_*>,_std::equal_to<spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>_>
  ::unordered_map(&this->continue_target_headers_);
  std::
  unordered_map<spvtools::val::BasicBlock_*,_int,_std::hash<spvtools::val::BasicBlock_*>,_std::equal_to<spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_int>_>_>
  ::unordered_map(&this->block_depth_);
  std::__cxx11::
  list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
  ::list(&this->execution_model_limitations_);
  std::__cxx11::
  list<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
  ::list(&this->limitations_);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&this->function_call_targets_);
  return;
}

Assistant:

Function::Function(uint32_t function_id, uint32_t result_type_id,
                   spv::FunctionControlMask function_control,
                   uint32_t function_type_id)
    : id_(function_id),
      function_type_id_(function_type_id),
      result_type_id_(result_type_id),
      function_control_(function_control),
      declaration_type_(FunctionDecl::kFunctionDeclUnknown),
      end_has_been_registered_(false),
      blocks_(),
      current_block_(nullptr),
      pseudo_entry_block_(0),
      pseudo_exit_block_(kInvalidId),
      cfg_constructs_(),
      variable_ids_(),
      parameter_ids_() {}